

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.hpp
# Opt level: O3

optional<unsigned_long_long,_0> __thiscall
cpptrace::detail::libdwarf::die_object::get_unsigned_attribute(die_object *this,Dwarf_Half attr_num)

{
  int iVar1;
  Dwarf_Half in_DX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  undefined6 in_register_00000032;
  undefined8 *puVar3;
  optional<unsigned_long_long,_0> oVar4;
  Dwarf_Unsigned val;
  Dwarf_Attribute attr;
  char *in_stack_ffffffffffffffb8;
  Dwarf_Attribute local_40;
  undefined1 local_37;
  Dwarf_Debug local_30;
  Dwarf_Attribute local_28;
  Dwarf_Error local_20;
  
  puVar3 = (undefined8 *)CONCAT62(in_register_00000032,attr_num);
  local_40 = (Dwarf_Attribute)0x0;
  iVar1 = dwarf_attr((Dwarf_Die)puVar3[1],in_DX,&local_28,(Dwarf_Error *)&local_40);
  if (iVar1 == 1) {
    handle_dwarf_error((Dwarf_Debug)*puVar3,(Dwarf_Error)local_40);
  }
  if (iVar1 == 0) {
    local_40 = local_28;
    local_37 = 1;
    local_20 = (Dwarf_Error)0x0;
    iVar1 = dwarf_formudata(local_28,(Dwarf_Unsigned *)&local_30,&local_20);
    if (iVar1 == 1) {
      handle_dwarf_error((Dwarf_Debug)*puVar3,local_20);
    }
    if (iVar1 != 0) {
      assert_fail((detail *)0x1,0x190a2c,
                  "optional<Dwarf_Unsigned> cpptrace::detail::libdwarf::die_object::get_unsigned_attribute(Dwarf_Half) const"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O3/_deps/cpptrace-src/src/symbols/dwarf/dwarf.hpp"
                  ,(source_location)ZEXT816(0xa5),in_stack_ffffffffffffffb8);
    }
    *(undefined1 *)&this->die = 1;
    this->dbg = local_30;
    dwarf_dealloc_attribute(local_28);
    uVar2 = extraout_RDX_00;
  }
  else {
    *(undefined1 *)&this->die = 0;
    uVar2 = extraout_RDX;
  }
  oVar4._8_8_ = uVar2;
  oVar4.field_0 = (anon_union_8_2_d41c7fdf_for_optional<unsigned_long_long,_0>_2)this;
  return oVar4;
}

Assistant:

optional<Dwarf_Unsigned> get_unsigned_attribute(Dwarf_Half attr_num) const {
            Dwarf_Attribute attr;
            if(wrap(dwarf_attr, die, attr_num, &attr) == DW_DLV_OK) {
                auto attwrapper = raii_wrap(attr, [] (Dwarf_Attribute attr) { dwarf_dealloc_attribute(attr); });
                // Dwarf_Half form = 0;
                // VERIFY(wrap(dwarf_whatform, attr, &form) == DW_DLV_OK);
                Dwarf_Unsigned val;
                VERIFY(wrap(dwarf_formudata, attr, &val) == DW_DLV_OK);
                return val;
            } else {
                return nullopt;
            }
        }